

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticModel.cpp
# Opt level: O0

vector<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
* __thiscall
psy::C::SemanticModel::
fieldsFor_CORE<std::vector<psy::C::FieldDeclarationSymbol_const*,std::allocator<psy::C::FieldDeclarationSymbol_const*>>>
          (vector<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
           *__return_storage_ptr__,SemanticModel *this,FieldDeclarationSyntax *node,
          vector<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
          *decls)

{
  iterator iVar1;
  bool bVar2;
  SymbolKind SVar3;
  int iVar4;
  pointer pSVar5;
  pointer ppVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar7;
  undefined4 extraout_var_01;
  value_type local_68;
  Symbol *local_60;
  DeclarationSymbol *decl_1;
  DeclaratorListSyntax *decltorIt;
  Symbol *local_48;
  DeclarationSymbol *decl;
  FieldDeclarationSyntax *local_38;
  _Node_iterator_base<std::pair<const_psy::C::SyntaxNode_*const,_psy::C::DeclarationSymbol_*>,_false>
  local_30;
  iterator it;
  vector<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
  *decls_local;
  FieldDeclarationSyntax *node_local;
  SemanticModel *this_local;
  
  it.
  super__Node_iterator_base<std::pair<const_psy::C::SyntaxNode_*const,_psy::C::DeclarationSymbol_*>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<const_psy::C::SyntaxNode_*const,_psy::C::DeclarationSymbol_*>,_false>
             )(_Node_iterator_base<std::pair<const_psy::C::SyntaxNode_*const,_psy::C::DeclarationSymbol_*>,_false>
               )decls;
  pSVar5 = std::
           unique_ptr<psy::C::SemanticModel::SemanticModelImpl,_std::default_delete<psy::C::SemanticModel::SemanticModelImpl>_>
           ::operator->(&this->impl_);
  local_38 = node;
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<const_psy::C::SyntaxNode_*,_psy::C::DeclarationSymbol_*,_std::hash<const_psy::C::SyntaxNode_*>,_std::equal_to<const_psy::C::SyntaxNode_*>,_std::allocator<std::pair<const_psy::C::SyntaxNode_*const,_psy::C::DeclarationSymbol_*>_>_>
       ::find(&pSVar5->declsBySyntax_,(key_type *)&local_38);
  pSVar5 = std::
           unique_ptr<psy::C::SemanticModel::SemanticModelImpl,_std::default_delete<psy::C::SemanticModel::SemanticModelImpl>_>
           ::operator->(&this->impl_);
  decl = (DeclarationSymbol *)
         std::
         unordered_map<const_psy::C::SyntaxNode_*,_psy::C::DeclarationSymbol_*,_std::hash<const_psy::C::SyntaxNode_*>,_std::equal_to<const_psy::C::SyntaxNode_*>,_std::allocator<std::pair<const_psy::C::SyntaxNode_*const,_psy::C::DeclarationSymbol_*>_>_>
         ::end(&pSVar5->declsBySyntax_);
  bVar2 = std::__detail::operator!=
                    (&local_30,
                     (_Node_iterator_base<std::pair<const_psy::C::SyntaxNode_*const,_psy::C::DeclarationSymbol_*>,_false>
                      *)&decl);
  if (bVar2) {
    ppVar6 = std::__detail::
             _Node_iterator<std::pair<const_psy::C::SyntaxNode_*const,_psy::C::DeclarationSymbol_*>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_psy::C::SyntaxNode_*const,_psy::C::DeclarationSymbol_*>,_false,_false>
                           *)&local_30);
    iVar4 = (*(ppVar6->second->super_Symbol)._vptr_Symbol[6])();
    local_48 = (Symbol *)CONCAT44(extraout_var,iVar4);
    SVar3 = Symbol::kind(local_48);
    iVar1 = it;
    if (SVar3 != FieldDeclaration) {
      poVar7 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
      poVar7 = std::operator<<(poVar7,
                               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/SemanticModel.cpp"
                              );
      poVar7 = std::operator<<(poVar7,":");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0xff);
      poVar7 = std::operator<<(poVar7," ");
      poVar7 = std::operator<<(poVar7,"<empty message>");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      std::
      vector<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
      ::vector(__return_storage_ptr__,
               (vector<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
                *)it.
                  super__Node_iterator_base<std::pair<const_psy::C::SyntaxNode_*const,_psy::C::DeclarationSymbol_*>,_false>
                  ._M_cur);
      return __return_storage_ptr__;
    }
    iVar4 = (*local_48->_vptr_Symbol[0x14])();
    decltorIt = (DeclaratorListSyntax *)CONCAT44(extraout_var_00,iVar4);
    std::
    vector<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
    ::push_back((vector<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
                 *)iVar1.
                   super__Node_iterator_base<std::pair<const_psy::C::SyntaxNode_*const,_psy::C::DeclarationSymbol_*>,_false>
                   ._M_cur,(value_type *)&decltorIt);
  }
  else {
    for (decl_1 = (DeclarationSymbol *)FieldDeclarationSyntax::declarators(node);
        decl_1 != (DeclarationSymbol *)0x0;
        decl_1 = (DeclarationSymbol *)decl_1[1].super_Symbol._vptr_Symbol) {
      local_60 = &declarationBy(this,(DeclaratorSyntax *)
                                     (decl_1->super_Symbol).impl_._M_t.
                                     super___uniq_ptr_impl<psy::C::Symbol::SymbolImpl,_std::default_delete<psy::C::Symbol::SymbolImpl>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_psy::C::Symbol::SymbolImpl_*,_std::default_delete<psy::C::Symbol::SymbolImpl>_>
                                     .super__Head_base<0UL,_psy::C::Symbol::SymbolImpl_*,_false>.
                                     _M_head_impl)->super_Symbol;
      if (local_60 == (Symbol *)0x0) {
        pSVar5 = std::
                 unique_ptr<psy::C::SemanticModel::SemanticModelImpl,_std::default_delete<psy::C::SemanticModel::SemanticModelImpl>_>
                 ::operator->(&this->impl_);
        if ((pSVar5->bindingIsOK_ & 1U) != 0) {
          poVar7 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
          poVar7 = std::operator<<(poVar7,
                                   "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/SemanticModel.cpp"
                                  );
          poVar7 = std::operator<<(poVar7,":");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x106);
          poVar7 = std::operator<<(poVar7," ");
          poVar7 = std::operator<<(poVar7,"<empty message>");
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        }
      }
      else {
        SVar3 = Symbol::kind(local_60);
        if (SVar3 != FieldDeclaration) {
          poVar7 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
          poVar7 = std::operator<<(poVar7,
                                   "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/SemanticModel.cpp"
                                  );
          poVar7 = std::operator<<(poVar7,":");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x109);
          poVar7 = std::operator<<(poVar7," ");
          poVar7 = std::operator<<(poVar7,"<empty message>");
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        }
        iVar1.
        super__Node_iterator_base<std::pair<const_psy::C::SyntaxNode_*const,_psy::C::DeclarationSymbol_*>,_false>
        ._M_cur = it.
                  super__Node_iterator_base<std::pair<const_psy::C::SyntaxNode_*const,_psy::C::DeclarationSymbol_*>,_false>
                  ._M_cur;
        iVar4 = (*local_60->_vptr_Symbol[0x14])();
        local_68 = (value_type)CONCAT44(extraout_var_01,iVar4);
        std::
        vector<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
        ::push_back((vector<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
                     *)iVar1.
                       super__Node_iterator_base<std::pair<const_psy::C::SyntaxNode_*const,_psy::C::DeclarationSymbol_*>,_false>
                       ._M_cur,&local_68);
      }
    }
  }
  std::
  vector<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
  ::vector(__return_storage_ptr__,
           (vector<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
            *)it.
              super__Node_iterator_base<std::pair<const_psy::C::SyntaxNode_*const,_psy::C::DeclarationSymbol_*>,_false>
              ._M_cur);
  return __return_storage_ptr__;
}

Assistant:

VecT SemanticModel::fieldsFor_CORE(
        const FieldDeclarationSyntax* node,
        VecT&& decls)
{
    // Anonymous structure/union fields are bound to the field declaration
    // syntax node while regular fields to the declarators syntax nodes.
    auto it = P->declsBySyntax_.find(node);
    if (it != P->declsBySyntax_.end()) {
        auto decl = it->second->asDeclaration();
        PSY_ASSERT_2(decl->kind() == SymbolKind::FieldDeclaration, return decls);
        decls.push_back(decl->asFieldDeclaration());
    }
    else {
        for (auto decltorIt = node->declarators(); decltorIt; decltorIt = decltorIt->next) {
            auto decl = declarationBy(decltorIt->value);
            if (!decl) {
                PSY_ASSERT_1(!P->bindingIsOK_);
                continue;
            }
            PSY_ASSERT_2(decl->kind() == SymbolKind::FieldDeclaration, continue);
            decls.push_back(decl->asFieldDeclaration());
        }
    }
    return std::move(decls);
}